

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

int vkt::tessellation::referenceTriangleNonPointModePrimitiveCount
              (SpacingMode spacingMode,int inner,int outer0,int outer1,int outer2)

{
  int iVar1;
  undefined4 local_2c;
  int curInnerTriangleLevel;
  int innerTriangleNdx;
  int numInnerTriangles;
  int result;
  int outer2_local;
  int outer1_local;
  int outer0_local;
  int inner_local;
  SpacingMode spacingMode_local;
  
  if (inner == 1) {
    if (((outer0 == 1) && (outer1 == 1)) && (outer2 == 1)) {
      inner_local = 1;
    }
    else {
      iVar1 = 2;
      if (spacingMode == SPACINGMODE_FRACTIONAL_ODD) {
        iVar1 = 3;
      }
      inner_local = referenceTriangleNonPointModePrimitiveCount
                              (spacingMode,iVar1,outer0,outer1,outer2);
    }
  }
  else {
    innerTriangleNdx = outer0 + outer1 + outer2;
    for (local_2c = 0; local_2c < inner / 2; local_2c = local_2c + 1) {
      iVar1 = inner + (local_2c + 1) * -2;
      if (iVar1 == 1) {
        innerTriangleNdx = innerTriangleNdx + 4;
      }
      else {
        innerTriangleNdx = iVar1 * 6 + innerTriangleNdx;
      }
    }
    inner_local = innerTriangleNdx;
  }
  return inner_local;
}

Assistant:

static int referenceTriangleNonPointModePrimitiveCount (const SpacingMode spacingMode, const int inner, const int outer0, const int outer1, const int outer2)
{
	if (inner == 1)
	{
		if (outer0 == 1 && outer1 == 1 && outer2 == 1)
			return 1;
		else
			return referenceTriangleNonPointModePrimitiveCount(spacingMode, spacingMode == SPACINGMODE_FRACTIONAL_ODD ? 3 : 2,
																			outer0, outer1, outer2);
	}
	else
	{
		int result = outer0 + outer1 + outer2;

		const int numInnerTriangles = inner/2;
		for (int innerTriangleNdx = 0; innerTriangleNdx < numInnerTriangles; innerTriangleNdx++)
		{
			const int curInnerTriangleLevel = inner - 2*(innerTriangleNdx+1);

			if (curInnerTriangleLevel == 1)
				result += 4;
			else
				result += 2*3*curInnerTriangleLevel;
		}

		return result;
	}
}